

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution1D::forward
          (Deconvolution1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  const_reference opt_00;
  const_reference activation_params;
  reference pvVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat *in_RDI;
  bool bVar3;
  int ret;
  Mat top_blob_bordered;
  int outw;
  int kernel_extent_w;
  int w;
  Mat *_bias_data;
  Mat bias_data_flattened;
  int k;
  int j;
  int i;
  float *wg;
  float *wg2;
  int g;
  int maxk;
  int inch_g;
  int outch_g;
  Mat weight_data_transposed;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  int _num_input;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  Allocator *in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  Mat *in_stack_fffffffffffffb70;
  Mat *in_stack_fffffffffffffb78;
  Mat *pMVar4;
  Mat *in_stack_fffffffffffffb80;
  Deconvolution1D *in_stack_fffffffffffffb88;
  void **ppvVar5;
  Mat *in_stack_fffffffffffffb90;
  Mat *pMVar6;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 uVar7;
  Mat *top_blob_00;
  value_type local_380;
  int local_334;
  int local_330;
  int local_32c;
  const_reference local_328;
  void *local_320;
  int *local_318;
  undefined8 local_310;
  undefined4 local_308;
  long *local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  int local_2e8;
  long local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  void *local_2c8;
  void *local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  void *local_2a8;
  int *local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long *local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  int local_270;
  long local_268;
  undefined4 local_260;
  Mat local_250;
  int local_204;
  int dilation_w;
  int local_1bc;
  
  top_blob_00 = (Mat *)0x0;
  opt_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  activation_params = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                     (in_RDX,(size_type)top_blob_00);
  iVar1 = opt_00->h;
  dilation_w = activation_params->w;
  local_204 = activation_params->h;
  pMVar4 = &local_250;
  local_250.data = (void *)0x0;
  local_250.refcount = (int *)0x0;
  local_250.elemsize = 0;
  local_250.elempack = 0;
  local_250.allocator = (Allocator *)0x0;
  local_250.dims = 0;
  local_250.w = 0;
  local_250.h = 0;
  local_250.d = 0;
  local_250.c = 0;
  local_250.cstep = 0;
  flatten(in_stack_fffffffffffffb90,(Mat *)in_stack_fffffffffffffb88,
          (Option *)in_stack_fffffffffffffb80);
  pMVar6 = &local_250;
  uVar7 = local_250.data == (void *)0x0 || local_250.cstep * (long)local_250.c == 0;
  if ((bool)uVar7) {
    local_1bc = -100;
    local_260 = 1;
    goto LAB_01d876d7;
  }
  local_2a8 = (void *)0x0;
  local_2a0 = (int *)0x0;
  local_298 = 0;
  local_290 = 0;
  local_288 = (long *)0x0;
  local_280 = 0;
  local_27c = 0;
  local_278 = 0;
  local_274 = 0;
  local_270 = 0;
  local_268 = 0;
  Mat::create(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60,
              in_stack_fffffffffffffb58);
  if (local_2a8 == (void *)0x0 || local_268 * local_270 == 0) {
    local_1bc = -100;
    local_260 = 1;
  }
  else {
    local_2ac = local_204 / 1;
    local_2b0 = iVar1 / 1;
    for (local_2b8 = 0; local_2b8 < 1; local_2b8 = local_2b8 + 1) {
      local_2c0 = (void *)((long)local_2a8 +
                          (long)(local_2b8 * local_2ac * local_2b0 * dilation_w) * 4);
      local_2c8 = (void *)((long)local_250.data +
                          (long)(local_2b8 * local_2b0 * local_2ac * dilation_w) * 4);
      for (local_2cc = 0; local_2cc < local_2ac; local_2cc = local_2cc + 1) {
        for (local_2d0 = 0; local_2d0 < local_2b0; local_2d0 = local_2d0 + 1) {
          for (local_2d4 = 0; local_2d4 < dilation_w; local_2d4 = local_2d4 + 1) {
            *(undefined4 *)
             ((long)local_2c0 +
             (long)((local_2cc * local_2b0 + local_2d0) * dilation_w + local_2d4) * 4) =
                 *(undefined4 *)
                  ((long)local_2c8 +
                  (long)((local_2d0 * local_2ac + local_2cc) * dilation_w + local_2d4) * 4);
          }
        }
      }
    }
    local_320 = (void *)0x0;
    local_318 = (int *)0x0;
    local_310 = 0;
    local_308 = 0;
    local_300 = (long *)0x0;
    local_2f8 = 0;
    local_2f4 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e0 = 0;
    local_2b4 = dilation_w;
    if (in_RDI[3].elempack == 0) {
LAB_01d86a9a:
      local_32c = opt_00->w;
      local_330 = *(int *)&in_RDI[3].data * (dilation_w + -1) + 1;
      local_334 = (local_32c + -1) * *(int *)((long)&in_RDI[3].data + 4) + local_330 +
                  (int)in_RDI[3].elemsize;
      local_380.data = (void *)0x0;
      local_380.refcount = (int *)0x0;
      local_380.elemsize = 0;
      local_380.elempack = 0;
      local_380.allocator = (Allocator *)0x0;
      local_380.dims = 0;
      local_380.w = 0;
      local_380.h = 0;
      local_380.d = 0;
      local_380.c = 0;
      local_380.cstep = 0;
      if (((*(int *)&in_RDI[3].refcount < 1) && (*(int *)((long)&in_RDI[3].refcount + 4) < 1)) &&
         (*(int *)((long)&in_RDI[3].elemsize + 4) < 1)) {
        if (&local_380 != pvVar2) {
          if (pvVar2->refcount != (int *)0x0) {
            LOCK();
            *pvVar2->refcount = *pvVar2->refcount + 1;
            UNLOCK();
          }
          local_380.data = pvVar2->data;
          local_380.refcount = pvVar2->refcount;
          local_380.elemsize = pvVar2->elemsize;
          local_380.elempack = pvVar2->elempack;
          local_380.allocator = pvVar2->allocator;
          local_380.dims = pvVar2->dims;
          local_380.w = pvVar2->w;
          local_380.h = pvVar2->h;
          local_380.d = pvVar2->d;
          local_380.c = pvVar2->c;
          local_380.cstep = pvVar2->cstep;
        }
        Mat::create(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,
                    in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      }
      else {
        Mat::create(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,
                    in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      }
      if (local_380.data == (void *)0x0 || local_380.cstep * (long)local_380.c == 0) {
        local_1bc = -100;
      }
      else {
        local_1bc = deconvolution1d(pMVar4,top_blob_00,in_RDI,
                                    (Mat *)CONCAT17(uVar7,in_stack_fffffffffffffc58),
                                    (int)((ulong)pMVar6 >> 0x20),(int)pMVar6,dilation_w,(int)pvVar2,
                                    activation_params,(Option *)opt_00);
        if (local_1bc == 0) {
          cut_padding(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                      (Option *)in_stack_fffffffffffffb70);
          bVar3 = true;
          if (pvVar2->data != (void *)0x0) {
            bVar3 = pvVar2->cstep * (long)pvVar2->c == 0;
          }
          if (bVar3) {
            local_1bc = -100;
          }
          else {
            local_1bc = 0;
          }
        }
      }
      local_260 = 1;
      if (local_380.refcount != (int *)0x0) {
        LOCK();
        iVar1 = *local_380.refcount;
        *local_380.refcount = *local_380.refcount + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_380.allocator == (Allocator *)0x0) {
            if (local_380.data != (void *)0x0) {
              free(local_380.data);
            }
          }
          else {
            (*(local_380.allocator)->_vptr_Allocator[3])(local_380.allocator,local_380.data);
          }
        }
      }
      local_380.data = (void *)0x0;
      local_380.elemsize = 0;
      local_380.elempack = 0;
      local_380.dims = 0;
      local_380.w = 0;
      local_380.h = 0;
      local_380.d = 0;
      local_380.c = 0;
      local_380.cstep = 0;
      local_380.refcount = (int *)0x0;
    }
    else {
      local_328 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
      flatten(in_stack_fffffffffffffb90,(Mat *)in_stack_fffffffffffffb88,
              (Option *)in_stack_fffffffffffffb80);
      if (local_320 != (void *)0x0 && local_2e0 * local_2e8 != 0) goto LAB_01d86a9a;
      local_1bc = -100;
      local_260 = 1;
    }
    if (local_318 != (int *)0x0) {
      LOCK();
      iVar1 = *local_318;
      *local_318 = *local_318 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_300 == (long *)0x0) {
          if (local_320 != (void *)0x0) {
            free(local_320);
          }
        }
        else {
          (**(code **)(*local_300 + 0x18))(local_300,local_320);
        }
      }
    }
    local_320 = (void *)0x0;
    local_310 = 0;
    local_308 = 0;
    local_2f8 = 0;
    local_2f4 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e0 = 0;
    local_318 = (int *)0x0;
  }
  ppvVar5 = &local_2a8;
  if (local_2a0 != (int *)0x0) {
    LOCK();
    iVar1 = *local_2a0;
    *local_2a0 = *local_2a0 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_288 == (long *)0x0) {
        if (local_2a8 != (void *)0x0) {
          free(local_2a8);
        }
      }
      else {
        (**(code **)(*local_288 + 0x18))(local_288,local_2a8);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
LAB_01d876d7:
  pMVar4 = &local_250;
  if (local_250.refcount != (int *)0x0) {
    LOCK();
    iVar1 = *local_250.refcount;
    *local_250.refcount = *local_250.refcount + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_250.allocator == (Allocator *)0x0) {
        if (local_250.data != (void *)0x0) {
          free(local_250.data);
        }
      }
      else {
        (*(local_250.allocator)->_vptr_Allocator[3])(local_250.allocator,local_250.data);
      }
    }
  }
  pMVar4->data = (void *)0x0;
  pMVar4->elemsize = 0;
  pMVar4->elempack = 0;
  pMVar4->dims = 0;
  pMVar4->w = 0;
  pMVar4->h = 0;
  pMVar4->d = 0;
  pMVar4->c = 0;
  pMVar4->cstep = 0;
  pMVar4->refcount = (int *)0x0;
  return local_1bc;
}

Assistant:

int Deconvolution1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}